

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

int tcv_get_escon_compliance_codes(tcv_t *tcv,tcv_escon_compliance_codes_t *codes)

{
  int iVar1;
  bool bVar2;
  
  if ((tcv == (tcv_t *)0x0) || (tcv->created != true)) {
    bVar2 = false;
  }
  else {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    bVar2 = iVar1 == 0;
  }
  iVar1 = -4;
  if ((codes != (tcv_escon_compliance_codes_t *)0x0) && (bVar2)) {
    iVar1 = -0xd;
    if ((tcv != (tcv_t *)0x0) && ((tcv->created == true && (tcv->initialized == true)))) {
      iVar1 = (*tcv->fun->get_escon_compliance_codes)(tcv,codes);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  return iVar1;
}

Assistant:

int tcv_get_escon_compliance_codes(tcv_t *tcv,
                                   tcv_escon_compliance_codes_t *codes)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !codes)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_escon_compliance_codes(tcv, codes);
	}

	tcv_unlock(tcv);
	return ret;
}